

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_compilation.cpp
# Opt level: O3

void __thiscall
SplitCompilationTest_empty_deque_long_Test<char32_t>::~SplitCompilationTest_empty_deque_long_Test
          (SplitCompilationTest_empty_deque_long_Test<char32_t> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(SplitCompilationTest, empty_deque_long) {
	std::basic_string_view<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>();
	EXPECT_TRUE(split<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n<std::deque>(empty, delim, 5).empty());
	EXPECT_TRUE(split_view<std::deque>(empty, delim).empty());
	EXPECT_TRUE(split_n_view<std::deque>(empty, delim, 5).empty());
}